

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O2

size_t derTEnc(octet *der,u32 tag)

{
  bool_t bVar1;
  long lVar2;
  size_t sVar3;
  u32 t;
  u32 uVar4;
  size_t sVar5;
  
  bVar1 = derTIsValid(tag);
  if (bVar1 == 0) {
    sVar3 = 0xffffffffffffffff;
  }
  else {
    lVar2 = 0;
    for (uVar4 = tag; uVar4 != 0; uVar4 = uVar4 >> 8) {
      lVar2 = lVar2 + 1;
    }
    sVar3 = lVar2 + (ulong)(lVar2 == 0);
    sVar5 = sVar3;
    if (der != (octet *)0x0) {
      while (sVar5 != 0) {
        der[sVar5 - 1] = (octet)tag;
        tag = tag >> 8;
        sVar5 = sVar5 - 1;
      }
    }
  }
  return sVar3;
}

Assistant:

static size_t derTEnc(octet der[], u32 tag)
{
	size_t t_count = 0;
	// проверить корректность
	if (!derTIsValid(tag))
		return SIZE_MAX;
	// определить длину кода
	{
		u32 t = tag;
		for (; t; ++t_count, t >>= 8);
		if (t_count == 0)
			t_count = 1;
	}
	// кодировать
	if (der)
	{
		size_t pos = t_count;
		ASSERT(memIsValid(der, t_count));
		while (pos--)
		{
			der[pos] = (octet)tag;
			tag >>= 8;
		}
		ASSERT(tag == 0);
	}
	return t_count;
}